

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::LowerInitForInEnumerator(Lowerer *this,Instr *instr)

{
  uint profileId;
  Func *this_00;
  code *pcVar1;
  bool bVar2;
  ProfiledInstr *pPVar3;
  JITTimeFunctionBody *this_01;
  EnumeratorCache *forInCache;
  undefined4 *puVar4;
  Opnd *forInEnumeratorOpnd;
  RegOpnd *newSrc;
  AddrOpnd *opndArg;
  
  this_00 = instr->m_func;
  if (instr->m_kind == InstrKindProfiled) {
    pPVar3 = IR::Instr::AsProfiledInstr(instr);
    profileId = (pPVar3->u).profileId;
    this_01 = Func::GetJITFunctionBody(instr->m_func);
    forInCache = JITTimeFunctionBody::GetForInCache(this_01,profileId);
    if (forInCache == (EnumeratorCache *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x7114,"(forInCache != nullptr)","forInCache != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    bVar2 = Func::IsSimpleJit(this_00);
    if ((!bVar2) &&
       (this_00->m_scriptContextInfo[0x77]._vptr_ScriptContextInfo[0x2d7] == (_func_int *)0x0)) {
      GenerateInitForInEnumeratorFastPath(this,instr,forInCache);
    }
  }
  else {
    forInCache = (EnumeratorCache *)0x0;
  }
  forInEnumeratorOpnd = IR::Instr::UnlinkSrc2(instr);
  newSrc = GenerateForInEnumeratorLoad(this,forInEnumeratorOpnd,instr);
  IR::Instr::SetSrc2(instr,&newSrc->super_Opnd);
  opndArg = IR::AddrOpnd::New(forInCache,AddrOpndKindForInCache,this_00,false,(Var)0x0);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&opndArg->super_Opnd);
  LowerBinaryHelperMem(this,instr,HelperOp_OP_InitForInEnumerator);
  return;
}

Assistant:

void
Lowerer::LowerInitForInEnumerator(IR::Instr * instr)
{
    Js::EnumeratorCache * forInCache = nullptr;
    Func * func = instr->m_func;
    if (instr->IsProfiledInstr())
    {
        uint profileId = instr->AsProfiledInstr()->u.profileId;
        forInCache = instr->m_func->GetJITFunctionBody()->GetForInCache(profileId);
        Assert(forInCache != nullptr);

        if (!func->IsSimpleJit()
#if ENABLE_TTD
            && (func->IsOOPJIT() || !func->GetScriptContext()->GetThreadContext()->IsRuntimeInTTDMode())
            //TODO: We will need to enable OOPJIT info to exclude this if we have a TTD Runtime
#endif
            )
        {
            GenerateInitForInEnumeratorFastPath(instr, forInCache);
        }
    }

    IR::RegOpnd * forInEnumeratorRegOpnd = GenerateForInEnumeratorLoad(instr->UnlinkSrc2(), instr);
    instr->SetSrc2(forInEnumeratorRegOpnd);
    m_lowererMD.LoadHelperArgument(instr, IR::AddrOpnd::New(forInCache, IR::AddrOpndKindForInCache, func));
    this->LowerBinaryHelperMem(instr, IR::HelperOp_OP_InitForInEnumerator);
}